

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O0

double __thiscall Tank::findHead(Tank *this,double aVolume)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  double local_38;
  double local_30;
  double local_28;
  double ucfArea;
  double aVolume_local;
  Tank *this_local;
  
  aVolume_local = (double)this;
  if (this->volCurve == (Curve *)0x0) {
    local_30 = 0.0;
    local_38 = aVolume - this->minVolume;
    ucfArea = aVolume;
    pdVar2 = std::max<double>(&local_30,&local_38);
    this_local = (Tank *)(this->minHead + *pdVar2 / this->area);
  }
  else {
    local_28 = this->ucfLength * this->ucfLength;
    ucfArea = local_28 * this->ucfLength * aVolume;
    dVar1 = (this->super_Node).elev;
    dVar3 = Curve::getXofY(this->volCurve,ucfArea);
    this_local = (Tank *)(dVar1 + dVar3 / this->ucfLength);
  }
  return (double)this_local;
}

Assistant:

double Tank::findHead(double aVolume)
{
    // ... tank has a volume curve (in original user units)

    if ( volCurve )
    {
        double ucfArea = ucfLength * ucfLength;
        aVolume *= ucfArea * ucfLength;
        return elev + volCurve->getXofY(aVolume) / ucfLength;
    }

    // ... tank is cylindrical

    else
    {
        aVolume = max(0.0, aVolume - minVolume);
        return minHead + aVolume / area;
    }
}